

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

bit_cost_t __thiscall
lzham::lzcompressor::state::get_len2_match_cost
          (state *this,CLZBase *lzbase,uint dict_pos,uint len2_match_dist,uint is_match_model_index)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  
  if (len2_match_dist < 0x1000) {
    uVar3 = (ulong)len2_match_dist;
    puVar5 = CLZBase::m_slot_tab0;
  }
  else if (len2_match_dist < 0x100000) {
    uVar3 = (ulong)(len2_match_dist >> 0xb);
    puVar5 = CLZBase::m_slot_tab1;
  }
  else {
    if (0xffffff < len2_match_dist) {
      if (len2_match_dist < 0x2000000) {
        uVar3 = (ulong)((len2_match_dist - 0x1000000 >> 0x17) + 0x30);
      }
      else if (len2_match_dist < 0x4000000) {
        uVar3 = (ulong)((len2_match_dist + 0xfe000000 >> 0x18) + 0x32);
      }
      else {
        uVar3 = (ulong)((len2_match_dist + 0xfc000000 >> 0x19) + 0x34);
      }
      goto LAB_0010b862;
    }
    uVar3 = (ulong)(len2_match_dist >> 0x10);
    puVar5 = CLZBase::m_slot_tab2;
  }
  uVar3 = (ulong)(byte)puVar5[uVar3];
LAB_0010b862:
  lVar2 = (ulong)*(uint *)((long)&g_prob_cost +
                          (ulong)this->m_is_rep_model[(this->super_state_base).m_cur_state].
                                 m_bit_0_prob * 4) +
          (ulong)*(uint *)((long)&g_prob_cost +
                          (ulong)(0x800 - this->m_is_match_model[is_match_model_index].m_bit_0_prob)
                          * 4) +
          (ulong)*(byte *)(*(long *)&this->field_0x228 + (ulong)((int)uVar3 * 8 - 6)) * 0x1000000;
  bVar1 = *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + uVar3);
  if (bVar1 < 3) {
    return lVar2 + (ulong)bVar1 * 0x1000000;
  }
  uVar4 = (ulong)(uint)((int)uVar3 << 2);
  uVar3 = 0;
  if (4 < bVar1) {
    uVar3 = (ulong)((uint)bVar1 * 0x1000000 + 0xfc000000);
  }
  return (ulong)*(byte *)(*(long *)&this->field_0x4f8 +
                         (ulong)(len2_match_dist -
                                 *(int *)((long)&CLZDecompBase::m_lzx_position_base + uVar4) &
                                 *(uint *)((long)&CLZDecompBase::m_lzx_position_extra_mask + uVar4)
                                & 0xf)) * 0x1000000 + uVar3 + lVar2;
}

Assistant:

bit_cost_t lzcompressor::state::get_len2_match_cost(CLZBase& lzbase, uint dict_pos, uint len2_match_dist, uint is_match_model_index)
   {
      LZHAM_NOTE_UNUSED(dict_pos);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      // full match
      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(len2_match_dist, match_slot, match_extra);

      const uint match_len = 2;
      uint match_low_sym = match_len - 2;

      uint match_high_sym = 0;

      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
      match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      uint main_sym = match_low_sym | (match_high_sym << 3);

      cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      return cost;
   }